

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

void matd_ltriangle_solve(matd_t *L,double *b,double *x)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  
  uVar1 = L->ncols;
  lVar2 = (long)(int)uVar1;
  if (0 < lVar2) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      dVar6 = b[lVar4];
      if (lVar4 != 0) {
        lVar5 = 0;
        do {
          dVar6 = dVar6 - (double)L[(ulong)(uint)((int)lVar3 + (int)lVar5) + 1] * x[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      x[lVar4] = dVar6 / (double)L[(ulong)((uVar1 + 1) * (int)lVar4) + 1];
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + lVar2;
    } while (lVar4 != lVar2);
  }
  return;
}

Assistant:

void matd_ltriangle_solve(matd_t *L, const TYPE *b, TYPE *x)
{
    int n = L->ncols;

    for (int i = 0; i < n; i++) {
        double acc = b[i];

        for (int j = 0; j < i; j++) {
            acc -= MATD_EL(L, i, j)*x[j];
        }

        x[i] = acc / MATD_EL(L, i, i);
    }
}